

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O3

string * __thiscall
re2c::InputAPI::stmt_backup_peek_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  long lVar1;
  undefined8 *puVar2;
  opt_t *poVar3;
  long *plVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  string local_150;
  string local_130;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined8 local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (this->type_ == DEFAULT) {
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    iVar8 = ind + 1;
    local_70 = &local_60;
    while ((poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar3->target != DOT &&
           (iVar8 = iVar8 + -1, iVar8 != 0))) {
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)(poVar3->indString)._M_dataplus._M_p)
      ;
    }
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(poVar3->yych)._M_dataplus._M_p);
    local_90 = &local_80;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_e0 = *puVar6;
      lStack_d8 = plVar4[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar6;
      local_f0 = (ulong *)*plVar4;
    }
    local_e8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Opt::yychConversion_abi_cxx11_(&local_b0,(Opt *)&opts);
    uVar10 = 0xf;
    if (local_f0 != &local_e0) {
      uVar10 = local_e0;
    }
    if (uVar10 < local_b0._M_string_length + local_e8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar9 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_b0._M_string_length + local_e8) goto LAB_001227c5;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_001227c5:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0._M_dataplus._M_p);
    }
    local_110 = &local_100;
    plVar4 = puVar2 + 2;
    if ((long *)*puVar2 == plVar4) {
      local_100 = *plVar4;
      uStack_f8 = puVar2[3];
    }
    else {
      local_100 = *plVar4;
      local_110 = (long *)*puVar2;
    }
    local_108 = puVar2[1];
    *puVar2 = plVar4;
    puVar2[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_d0 = &local_c0;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_c0 = *plVar5;
      lStack_b8 = plVar4[3];
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*plVar4;
    }
    local_c8 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(poVar3->yymarker)._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_40 = *plVar5;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar5;
      local_50 = (long *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_150.field_2._M_allocated_capacity = *puVar6;
      local_150.field_2._8_8_ = plVar4[3];
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *puVar6;
      local_150._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_150._M_string_length = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_150,(ulong)(poVar3->yycursor)._M_dataplus._M_p);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_130.field_2._M_allocated_capacity = *puVar6;
      local_130.field_2._8_8_ = plVar4[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *puVar6;
      local_130._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_130._M_string_length = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar7) {
      lVar1 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 == &local_60) {
      return __return_storage_ptr__;
    }
    uVar9 = CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
    _Var11._M_p = (pointer)local_70;
    goto LAB_00122b1f;
  }
  stmt_backup_abi_cxx11_(&local_130,this,ind);
  stmt_peek_abi_cxx11_(&local_150,this,ind);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    uVar9 = local_130.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_150._M_string_length + local_130._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar9 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_150._M_string_length + local_130._M_string_length) goto LAB_00122591;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_150,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
  }
  else {
LAB_00122591:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_150._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar7) {
    uVar9 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar7;
  puVar2[1] = 0;
  *(undefined1 *)psVar7 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  uVar9 = local_130.field_2._M_allocated_capacity;
  _Var11._M_p = local_130._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p == &local_130.field_2) {
    return __return_storage_ptr__;
  }
LAB_00122b1f:
  operator_delete(_Var11._M_p,uVar9 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_backup_peek (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yych + " = " + opts.yychConversion () + "*(" + opts->yymarker + " = " + opts->yycursor + ");\n"
		: stmt_backup (ind) + stmt_peek (ind);
}